

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

int str_all_space(char *str)

{
  char cVar1;
  ushort **ppuVar2;
  
  do {
    cVar1 = *str;
    if ((long)cVar1 == 0) {
      return 1;
    }
    ppuVar2 = __ctype_b_loc();
    str = str + 1;
  } while ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  return 0;
}

Assistant:

int str_all_space(const char *str) {
  const char *p = str;
  while (*p) {
    if (isspace(*p) == 0) {
      return 0;
    }
    ++p;
  }
  return 1;
}